

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::full_formatter::format
          (full_formatter *this,log_msg *msg,tm *tm_time,memory_buf_t *dest)

{
  memory_buf_t *dest_00;
  int iVar1;
  size_t sVar2;
  long lVar3;
  undefined *__src;
  tm *ptVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  ptrdiff_t _Num_1;
  ulong uVar11;
  ptrdiff_t _Num;
  ptrdiff_t _Num_2;
  ulong uVar12;
  size_t sVar13;
  char *__s;
  ptrdiff_t _Num_6;
  format_int local_60;
  tm *local_40;
  long local_38;
  
  lVar3 = (msg->time).__d.__r / 1000000000;
  if (((this->cache_timestamp_).__r != lVar3) ||
     ((this->cached_datetime_).super_buffer<char>.size_ == 0)) {
    dest_00 = &this->cached_datetime_;
    (this->cached_datetime_).super_buffer<char>.size_ = 0;
    local_38 = lVar3;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ == 0) {
      (**(dest_00->super_buffer<char>)._vptr_buffer)(dest_00,1);
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar7[sVar2] = '[';
    iVar1 = tm_time->tm_year;
    uVar6 = iVar1 + 0x76c;
    uVar5 = -uVar6;
    if (0 < (int)uVar6) {
      uVar5 = uVar6;
    }
    local_40 = tm_time;
    pcVar7 = fmt::v6::format_int::format_decimal(&local_60,(ulong)uVar5);
    local_60.str_ = pcVar7;
    if (iVar1 < -0x76c) {
      local_60.str_ = pcVar7 + -1;
      pcVar7[-1] = '-';
    }
    pcVar7 = local_60.str_;
    sVar13 = (long)&local_60 + (0x15 - (long)local_60.str_);
    uVar12 = sVar13 + (this->cached_datetime_).super_buffer<char>.size_;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar12) {
      (**(dest_00->super_buffer<char>)._vptr_buffer)(dest_00,uVar12);
    }
    if (local_60.buffer_ + 0x15 != pcVar7) {
      memmove((this->cached_datetime_).super_buffer<char>.ptr_ +
              (this->cached_datetime_).super_buffer<char>.size_,pcVar7,sVar13);
    }
    (this->cached_datetime_).super_buffer<char>.size_ = uVar12;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar12 + 1) {
      (**(dest_00->super_buffer<char>)._vptr_buffer)(dest_00,uVar12 + 1);
    }
    ptVar4 = local_40;
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar7[sVar2] = '-';
    fmt_helper::pad2(local_40->tm_mon + 1,dest_00);
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(dest_00->super_buffer<char>)._vptr_buffer)(dest_00);
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar7[sVar2] = '-';
    fmt_helper::pad2(ptVar4->tm_mday,dest_00);
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(dest_00->super_buffer<char>)._vptr_buffer)(dest_00);
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar7[sVar2] = ' ';
    fmt_helper::pad2(ptVar4->tm_hour,dest_00);
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(dest_00->super_buffer<char>)._vptr_buffer)(dest_00);
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar7[sVar2] = ':';
    fmt_helper::pad2(ptVar4->tm_min,dest_00);
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(dest_00->super_buffer<char>)._vptr_buffer)(dest_00);
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar7[sVar2] = ':';
    fmt_helper::pad2(ptVar4->tm_sec,dest_00);
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(dest_00->super_buffer<char>)._vptr_buffer)(dest_00);
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar7[sVar2] = '.';
    (this->cache_timestamp_).__r = local_38;
  }
  pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
  sVar13 = (this->cached_datetime_).super_buffer<char>.size_;
  uVar12 = (dest->super_buffer<char>).size_ + sVar13;
  if ((dest->super_buffer<char>).capacity_ < uVar12) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar12);
  }
  if (sVar13 != 0) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,sVar13);
  }
  (dest->super_buffer<char>).size_ = uVar12;
  lVar3 = (msg->time).__d.__r;
  uVar11 = (lVar3 / 1000000000) * 0xfffffc18 + lVar3 / 1000000;
  uVar10 = (uint)uVar11;
  uVar5 = uVar10 | 1;
  uVar6 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  uVar6 = (uVar6 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar6 = (uVar6 + 1) -
          (uint)(uVar10 < *(uint *)(fmt::v6::internal::basic_data<void>::zero_or_powers_of_10_32 +
                                   (ulong)uVar6 * 4));
  if (uVar6 < 3) {
    sVar13 = 3 - (ulong)uVar6;
    uVar12 = uVar12 + sVar13;
    if ((dest->super_buffer<char>).capacity_ < uVar12) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar12);
    }
    if ((ulong)uVar6 != 3) {
      memcpy((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,
             "0000000000000000000",sVar13);
    }
    (dest->super_buffer<char>).size_ = uVar12;
  }
  pcVar8 = fmt::v6::format_int::format_decimal(&local_60,uVar11 & 0xffffffff);
  pcVar7 = local_60.buffer_ + 0x15;
  uVar12 = (dest->super_buffer<char>).size_ + ((long)pcVar7 - (long)pcVar8);
  local_60.str_ = pcVar8;
  if ((dest->super_buffer<char>).capacity_ < uVar12) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar12);
  }
  if (pcVar7 != pcVar8) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar8,
            (long)pcVar7 - (long)pcVar8);
  }
  (dest->super_buffer<char>).size_ = uVar12;
  if ((dest->super_buffer<char>).capacity_ < uVar12 + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar12 + 1);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ']';
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ' ';
  if ((msg->logger_name).size_ != 0) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = '[';
    pcVar8 = (msg->logger_name).data_;
    if (pcVar8 != (char *)0x0) {
      sVar13 = (msg->logger_name).size_;
      uVar12 = (dest->super_buffer<char>).size_ + sVar13;
      if ((dest->super_buffer<char>).capacity_ < uVar12) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar12);
      }
      if (sVar13 != 0) {
        memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar8,sVar13);
      }
      (dest->super_buffer<char>).size_ = uVar12;
    }
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ']';
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ' ';
  }
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = '[';
  sVar2 = (dest->super_buffer<char>).size_;
  msg->color_range_start = sVar2;
  __src = (&level::level_string_views)[(ulong)msg->level * 2];
  if (__src != (undefined *)0x0) {
    sVar13 = *(size_t *)(&DAT_001cb6f8 + (ulong)msg->level * 0x10);
    uVar12 = sVar2 + sVar13;
    if ((dest->super_buffer<char>).capacity_ < uVar12) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar12);
    }
    if (sVar13 != 0) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,sVar13);
    }
    (dest->super_buffer<char>).size_ = uVar12;
  }
  sVar2 = (dest->super_buffer<char>).size_;
  msg->color_range_end = sVar2;
  if ((dest->super_buffer<char>).capacity_ < sVar2 + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ']';
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ' ';
  if ((msg->source).line != 0) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = '[';
    pcVar8 = (msg->source).filename;
    pcVar9 = strrchr(pcVar8,0x2f);
    __s = pcVar9 + 1;
    if (pcVar9 == (char *)0x0) {
      __s = pcVar8;
    }
    sVar13 = strlen(__s);
    if (__s != (char *)0x0) {
      uVar12 = (dest->super_buffer<char>).size_ + sVar13;
      if ((dest->super_buffer<char>).capacity_ < uVar12) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar12);
      }
      if (sVar13 != 0) {
        memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__s,sVar13);
      }
      (dest->super_buffer<char>).size_ = uVar12;
    }
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ':';
    uVar6 = (msg->source).line;
    uVar5 = -uVar6;
    if (0 < (int)uVar6) {
      uVar5 = uVar6;
    }
    pcVar8 = fmt::v6::format_int::format_decimal(&local_60,(ulong)uVar5);
    local_60.str_ = pcVar8;
    if ((int)uVar6 < 0) {
      local_60.str_ = pcVar8 + -1;
      pcVar8[-1] = '-';
    }
    pcVar8 = local_60.str_;
    sVar13 = (long)pcVar7 - (long)local_60.str_;
    uVar12 = (dest->super_buffer<char>).size_ + sVar13;
    if ((dest->super_buffer<char>).capacity_ < uVar12) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar12);
    }
    if (pcVar7 != pcVar8) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar8,sVar13);
    }
    (dest->super_buffer<char>).size_ = uVar12;
    if ((dest->super_buffer<char>).capacity_ < uVar12 + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar12 + 1);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ']';
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ' ';
  }
  pcVar7 = (msg->payload).data_;
  if (pcVar7 != (char *)0x0) {
    sVar13 = (msg->payload).size_;
    uVar12 = (dest->super_buffer<char>).size_ + sVar13;
    if ((dest->super_buffer<char>).capacity_ < uVar12) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar12);
    }
    if (sVar13 != 0) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,sVar13);
    }
    (dest->super_buffer<char>).size_ = uVar12;
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override
    {
        using std::chrono::duration_cast;
        using std::chrono::milliseconds;
        using std::chrono::seconds;

        // cache the date/time part for the next second.
        auto duration = msg.time.time_since_epoch();
        auto secs = duration_cast<seconds>(duration);

        if (cache_timestamp_ != secs || cached_datetime_.size() == 0)
        {
            cached_datetime_.clear();
            cached_datetime_.push_back('[');
            fmt_helper::append_int(tm_time.tm_year + 1900, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mon + 1, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mday, cached_datetime_);
            cached_datetime_.push_back(' ');

            fmt_helper::pad2(tm_time.tm_hour, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_min, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_sec, cached_datetime_);
            cached_datetime_.push_back('.');

            cache_timestamp_ = secs;
        }
        dest.append(cached_datetime_.begin(), cached_datetime_.end());

        auto millis = fmt_helper::time_fraction<milliseconds>(msg.time);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        dest.push_back(']');
        dest.push_back(' ');

#ifndef SPDLOG_NO_NAME
        if (msg.logger_name.size() > 0)
        {
            dest.push_back('[');
            // fmt_helper::append_str(*msg.logger_name, dest);
            fmt_helper::append_string_view(msg.logger_name, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }
#endif
        dest.push_back('[');
        // wrap the level name with color
        msg.color_range_start = dest.size();
        // fmt_helper::append_string_view(level::to_c_str(msg.level), dest);
        fmt_helper::append_string_view(level::to_string_view(msg.level), dest);
        msg.color_range_end = dest.size();
        dest.push_back(']');
        dest.push_back(' ');

        // add source location if present
        if (!msg.source.empty())
        {
            dest.push_back('[');
            const char *filename = details::short_filename_formatter<details::null_scoped_padder>::basename(msg.source.filename);
            fmt_helper::append_string_view(filename, dest);
            dest.push_back(':');
            fmt_helper::append_int(msg.source.line, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }
        // fmt_helper::append_string_view(msg.msg(), dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }